

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O0

string * __thiscall DSK::ReadDskDir_abi_cxx11_(string *__return_storage_ptr__,DSK *this)

{
  int iVar1;
  StDirEntry *pSVar2;
  long lVar3;
  bool local_a09;
  int local_9e4;
  int t;
  int p;
  ostringstream local_9c0 [8];
  ostringstream c;
  int local_838;
  int j;
  undefined8 uStack_831;
  char Nom [13];
  int i_1;
  int i;
  StDirEntry TabDir [64];
  DSK *this_local;
  string *catalogue;
  
  TabDir[0x3f].Blocks._8_8_ = this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  Nom[9] = '\0';
  Nom[10] = '\0';
  Nom[0xb] = '\0';
  Nom[0xc] = '\0';
  for (; (int)Nom._9_4_ < 0x40; Nom._9_4_ = Nom._9_4_ + 1) {
    lVar3 = (long)(int)Nom._9_4_;
    pSVar2 = GetInfoDirEntry(this,Nom._9_4_);
    *(undefined8 *)(&i + lVar3 * 8) = *(undefined8 *)pSVar2;
    *(undefined8 *)(TabDir + lVar3) = *(undefined8 *)(pSVar2->Nom + 7);
    *(undefined8 *)(TabDir[lVar3].Nom + 7) = *(undefined8 *)pSVar2->Blocks;
    *(undefined8 *)TabDir[lVar3].Blocks = *(undefined8 *)(pSVar2->Blocks + 8);
  }
  Nom[5] = '\0';
  Nom[6] = '\0';
  Nom[7] = '\0';
  Nom[8] = '\0';
  for (; (int)Nom._5_4_ < 0x40; Nom._5_4_ = Nom._5_4_ + 1) {
    if (((char)(&i)[(long)(int)Nom._5_4_ * 8] != -0x1b) && (TabDir[(int)Nom._5_4_].Nom[3] == '\0'))
    {
      uStack_831 = *(undefined8 *)((long)&i + (long)(int)Nom._5_4_ * 0x20 + 1);
      Nom._1_2_ = *(undefined2 *)TabDir[(int)Nom._5_4_].Nom;
      Nom[3] = TabDir[(int)Nom._5_4_].Nom[2];
      Nom[0] = '.';
      Nom[4] = '\0';
      for (local_838 = 0; local_838 < 0xc; local_838 = local_838 + 1) {
        *(byte *)((long)&stack0xfffffffffffff7cf + (long)local_838) =
             *(byte *)((long)&stack0xfffffffffffff7cf + (long)local_838) & 0x7f;
        iVar1 = isprint((int)*(char *)((long)&stack0xfffffffffffff7cf + (long)local_838));
        if (iVar1 == 0) {
          *(undefined1 *)((long)&stack0xfffffffffffff7cf + (long)local_838) = 0x3f;
        }
      }
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(char *)&stack0xfffffffffffff7cf);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
      std::__cxx11::ostringstream::ostringstream(local_9c0);
      std::ostream::operator<<((ostream *)local_9c0,(uint)*(byte *)(&i + (long)(int)Nom._5_4_ * 8));
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&t);
      std::__cxx11::string::~string((string *)&t);
      local_9e4 = 0;
      do {
        local_9e4 = local_9e4 + 1;
        local_a09 = TabDir[local_9e4 + Nom._5_4_].Nom[3] != '\0' && local_9e4 + Nom._5_4_ < 0x40;
      } while (local_a09);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
      std::__cxx11::ostringstream::~ostringstream(local_9c0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DSK::ReadDskDir( void ) {
	StDirEntry TabDir[ 64 ];
	string catalogue;
	for ( int i = 0; i < 64; i++ ) {
		memcpy( &TabDir[ i ]
				, GetInfoDirEntry( i )
				, sizeof( StDirEntry )
			  );
	}
	// Trier les fichiers
	for ( int i = 0; i < 64; i++ ) {
		//
		// Afficher les fichiers non effac�s
		//
		if ( TabDir[ i ].User != USER_DELETED && ! TabDir[ i ].NumPage ) {
			char Nom[ 13 ];
			memcpy( Nom, TabDir[ i ].Nom, 8 );
			memcpy( &Nom[ 9 ], TabDir[ i ].Ext, 3 );
			Nom[ 8 ] = '.';
			Nom[ 12 ] = 0;
			//
			// Masquer les bits d'attributs
			//
			for ( int j = 0; j < 12; j++ )
			{
				Nom[ j ] &= 0x7F;

				if ( ! isprint( Nom[ j ] ) ) 
					Nom[ j ] = '?' ;
			}

			catalogue += Nom;
			catalogue += " "; 
			ostringstream c;
			c << (int)TabDir[i].User;
			catalogue += c.str();
			//
			// Calcule la taille du fichier en fonction du nombre de blocs
			//
			int p = 0, t = 0;
			do {
				if ( TabDir[ p + i ].User == TabDir[ i ].User )
					t += TabDir[ p + i ].NbPages;
				p++;
			} while( TabDir[ p + i ].NumPage && ( p + i ) < 64  );
            //string size = GetTaille( ( t + 7 ) >> 3  );
            //catalogue+= " : " + size + "\n";
            catalogue += "\n";

		}
	}
	return catalogue;
}